

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O1

bool __thiscall
binlog::SessionWriter::
addEvent<std::vector<int,std::allocator<int>>,std::__cxx11::list<bool,std::allocator<bool>>>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          vector<int,_std::allocator<int>_> *args,list<bool,_std::allocator<bool>_> *args_1)

{
  char **ppcVar1;
  Queue *pQVar2;
  long lVar3;
  size_t sVar4;
  _List_node_base *p_Var5;
  int iVar6;
  const_iterator __end0;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  size_t sizes [4];
  long local_58 [5];
  
  local_58[0] = 8;
  local_58[1] = 8;
  local_58[2] = (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish +
                (4 - (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start);
  local_58[3] = 3;
  p_Var5 = (_List_node_base *)args_1;
  do {
    p_Var5 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    local_58[3] = local_58[3] + 1;
  } while (p_Var5 != (_List_node_base *)args_1);
  lVar9 = 0;
  lVar10 = 0;
  lVar3 = 0;
  do {
    lVar9 = lVar9 + local_58[lVar3];
    lVar10 = lVar10 + local_58[lVar3 + 1];
    lVar3 = lVar3 + 2;
  } while (lVar3 != 4);
  uVar8 = lVar10 + lVar9 + 4;
  if ((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar8) {
    sVar4 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw);
    if (((sVar4 < uVar8) &&
        (replaceChannel(this,uVar8),
        (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < uVar8)) &&
       (sVar4 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw), sVar4 < uVar8)) {
      return false;
    }
  }
  *(int *)(this->_qw)._writePos = (int)(lVar10 + lVar9);
  pcVar7 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar7 + 4;
  *(uint64_t *)(pcVar7 + 4) = eventSourceId;
  pcVar7 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar7 + 8;
  *(uint64_t *)(pcVar7 + 8) = clock;
  pcVar7 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar7 + 8;
  uVar8 = (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  iVar6 = (int)(uVar8 >> 2);
  *(int *)(pcVar7 + 8) = iVar6;
  pcVar7 = (this->_qw)._writePos + 4;
  (this->_qw)._writePos = pcVar7;
  if (iVar6 != 0) {
    uVar8 = uVar8 & 0x3fffffffc;
    memcpy(pcVar7,(args->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start,uVar8);
    ppcVar1 = &(this->_qw)._writePos;
    *ppcVar1 = *ppcVar1 + uVar8;
  }
  *(int *)(this->_qw)._writePos =
       (int)(args_1->super__List_base<bool,_std::allocator<bool>_>)._M_impl._M_node._M_size;
  ppcVar1 = &(this->_qw)._writePos;
  *ppcVar1 = *ppcVar1 + 4;
  for (p_Var5 = (args_1->super__List_base<bool,_std::allocator<bool>_>)._M_impl._M_node.
                super__List_node_base._M_next; p_Var5 != (_List_node_base *)args_1;
      p_Var5 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var5->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next) {
    *(this->_qw)._writePos = *(char *)&p_Var5[1]._M_next;
    ppcVar1 = &(this->_qw)._writePos;
    *ppcVar1 = *ppcVar1 + 1;
  }
  pQVar2 = (this->_qw)._queue;
  (pQVar2->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(this->_qw)._writePos - (long)pQVar2->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}